

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

int Abc_NtkRecTruthCompare(int *p1,int *p2)

{
  char cVar1;
  char cVar2;
  int iVar3;
  word *__s1;
  word *__s2;
  
  cVar1 = Vec_StrEntry(s_pMan3->vSupps,*p1);
  cVar2 = Vec_StrEntry(s_pMan3->vSupps,*p2);
  if ((int)cVar1 - (int)cVar2 != 0) {
    return (int)cVar1 - (int)cVar2;
  }
  __s1 = Vec_MemReadEntry(s_pMan3->vTtMem,*p1);
  __s2 = Vec_MemReadEntry(s_pMan3->vTtMem,*p2);
  iVar3 = memcmp(__s1,__s2,(long)s_pMan3->nWords << 3);
  return iVar3;
}

Assistant:

int Abc_NtkRecTruthCompare( int * p1, int * p2 ) 
{
    int Diff = Vec_StrEntry( s_pMan3->vSupps, *p1 ) - Vec_StrEntry( s_pMan3->vSupps, *p2 );
    if ( Diff )
        return Diff;
    return memcmp( Vec_MemReadEntry(s_pMan3->vTtMem, *p1), Vec_MemReadEntry(s_pMan3->vTtMem, *p2), sizeof(word) * s_pMan3->nWords ); 
}